

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O3

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init_asio
          (endpoint<websocketpp::config::asio::transport_config> *this)

{
  io_context *this_00;
  pointer *__ptr;
  
  this_00 = (io_context *)operator_new(0x10);
  ::asio::io_context::io_context(this_00);
  init_asio(this,this_00);
  this->m_external_io_service = false;
  return;
}

Assistant:

void init_asio() {
        // Use a smart pointer until the call is successful and ownership has 
        // successfully been taken. Use unique_ptr when available.
        // TODO: remove the use of auto_ptr when C++98/03 support is no longer
        //       necessary.
#ifdef _WEBSOCKETPP_CPP11_MEMORY_
        lib::unique_ptr<lib::asio::io_service> service(new lib::asio::io_service());
#else
        lib::auto_ptr<lib::asio::io_service> service(new lib::asio::io_service());
#endif
        init_asio( service.get() );
        // If control got this far without an exception, then ownership has successfully been taken
        service.release();
        m_external_io_service = false;
    }